

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg.cpp
# Opt level: O0

namespace_t * __thiscall cfgfile::generator::cfg::tag_namespace_t::cfg(tag_namespace_t *this)

{
  bool bVar1;
  pos_t pVar2;
  size_type sVar3;
  class_t *pcVar4;
  tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
  *in_RSI;
  namespace_t *in_RDI;
  size_t i_1;
  size_t i;
  namespace_t *n;
  tag_class_t *in_stack_00000328;
  tag_class_t *in_stack_fffffffffffffe38;
  tag_vector_of_tags_t<cfgfile::generator::cfg::tag_namespace_t,_cfgfile::string_trait_t>
  *in_stack_fffffffffffffe40;
  class_t *this_00;
  tag_namespace_t *in_stack_fffffffffffffe58;
  class_t *local_a0;
  ulong local_30;
  undefined7 in_stack_ffffffffffffffe8;
  undefined1 uVar5;
  
  uVar5 = 0;
  namespace_t::namespace_t((namespace_t *)in_stack_fffffffffffffe40);
  tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
  ::value(in_RSI);
  namespace_t::set_name
            ((namespace_t *)in_stack_fffffffffffffe40,(string *)in_stack_fffffffffffffe38);
  pVar2 = tag_t<cfgfile::string_trait_t>::line_number(&in_RSI->super_tag_t<cfgfile::string_trait_t>)
  ;
  namespace_t::set_line_number(in_RDI,pVar2);
  pVar2 = tag_t<cfgfile::string_trait_t>::column_number
                    (&in_RSI->super_tag_t<cfgfile::string_trait_t>);
  namespace_t::set_column_number(in_RDI,pVar2);
  bVar1 = tag_t<cfgfile::string_trait_t>::is_defined
                    ((tag_t<cfgfile::string_trait_t> *)in_stack_fffffffffffffe58);
  if (bVar1) {
    for (local_30 = 0;
        sVar3 = tag_vector_of_tags_t<cfgfile::generator::cfg::tag_namespace_t,_cfgfile::string_trait_t>
                ::size((tag_vector_of_tags_t<cfgfile::generator::cfg::tag_namespace_t,_cfgfile::string_trait_t>
                        *)0x10f0ae), local_30 < sVar3; local_30 = local_30 + 1) {
      in_stack_fffffffffffffe58 =
           tag_vector_of_tags_t<cfgfile::generator::cfg::tag_namespace_t,_cfgfile::string_trait_t>::
           at(in_stack_fffffffffffffe40,(size_type)in_stack_fffffffffffffe38);
      cfg((tag_namespace_t *)CONCAT17(uVar5,in_stack_ffffffffffffffe8));
      namespace_t::add_namespace
                ((namespace_t *)in_stack_fffffffffffffe40,(namespace_t *)in_stack_fffffffffffffe38);
      namespace_t::~namespace_t((namespace_t *)in_stack_fffffffffffffe40);
    }
  }
  bVar1 = tag_t<cfgfile::string_trait_t>::is_defined
                    ((tag_t<cfgfile::string_trait_t> *)in_stack_fffffffffffffe58);
  if (bVar1) {
    local_a0 = (class_t *)0x0;
    while (this_00 = local_a0,
          pcVar4 = (class_t *)
                   tag_vector_of_tags_t<cfgfile::generator::cfg::tag_class_t,_cfgfile::string_trait_t>
                   ::size((tag_vector_of_tags_t<cfgfile::generator::cfg::tag_class_t,_cfgfile::string_trait_t>
                           *)0x10f1c5), this_00 < pcVar4) {
      in_stack_fffffffffffffe38 =
           tag_vector_of_tags_t<cfgfile::generator::cfg::tag_class_t,_cfgfile::string_trait_t>::at
                     ((tag_vector_of_tags_t<cfgfile::generator::cfg::tag_class_t,_cfgfile::string_trait_t>
                       *)this_00,(size_type)in_stack_fffffffffffffe38);
      tag_class_t::cfg(in_stack_00000328);
      namespace_t::add_class((namespace_t *)this_00,(class_t *)in_stack_fffffffffffffe38);
      class_t::~class_t(this_00);
      local_a0 = (class_t *)&local_a0->field_0x1;
    }
  }
  return in_RDI;
}

Assistant:

namespace_t
tag_namespace_t::cfg() const
{
	namespace_t n;
	n.set_name( value() );
	n.set_line_number( line_number() );
	n.set_column_number( column_number() );

	if( m_nested_namespaces.is_defined() )
	{
		for( std::size_t i = 0; i < m_nested_namespaces.size(); ++i )
			n.add_namespace( m_nested_namespaces.at( i ).cfg() );
	}

	if( m_classes.is_defined() )
	{
		for( std::size_t i = 0; i < m_classes.size(); ++i )
			n.add_class( m_classes.at( i ).cfg() );
	}

	return n;
}